

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O2

int main(void)

{
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pNVar1;
  pointer pNVar2;
  pointer right_ptr;
  ostream *poVar3;
  allocator<char> local_137;
  allocator<char> local_136;
  allocator<char> local_135;
  allocator<char> local_134;
  allocator<char> local_133;
  allocator<char> local_132;
  allocator<char> local_131;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_130;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_128;
  pointer local_120;
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  family;
  iterator __begin1;
  string local_f0 [32];
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_130 = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)operator_new(0x40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&__begin1,"me",&local_131);
  pNVar1 = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
           )operator_new(0x40);
  local_128 = pNVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"mother",&local_132);
  pNVar2 = (pointer)operator_new(0x40);
  local_120 = pNVar2;
  std::__cxx11::string::string<std::allocator<char>>(local_70,"mother\'s mother",&local_133);
  std::__cxx11::string::string((string *)pNVar2,local_70);
  pNVar2->left = (pointer)0x0;
  pNVar2->right = (pointer)0x0;
  pNVar2 = (pointer)operator_new(0x40);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"mother\'s father",&local_134);
  std::__cxx11::string::string((string *)pNVar2,local_90);
  pNVar2->left = (pointer)0x0;
  pNVar2->right = (pointer)0x0;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Node
            (pNVar1,&local_50,local_120,pNVar2);
  pNVar1 = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
           )operator_new(0x40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"father",&local_135);
  pNVar2 = (pointer)operator_new(0x40);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"father\'s mother",&local_136);
  std::__cxx11::string::string((string *)pNVar2,local_d0);
  pNVar2->left = (pointer)0x0;
  pNVar2->right = (pointer)0x0;
  right_ptr = (pointer)operator_new(0x40);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"father\'s father",&local_137);
  std::__cxx11::string::string((string *)right_ptr,local_f0);
  right_ptr->left = (pointer)0x0;
  right_ptr->right = (pointer)0x0;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Node
            (pNVar1,&local_b0,pNVar2,right_ptr);
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Node
            (local_130,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1,
             local_128,pNVar1);
  family.root = local_130;
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&__begin1);
  __begin1 = BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(&family);
  while (__begin1.current !=
         (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)__begin1.current);
    std::endl<char,std::char_traits<char>>(poVar3);
    BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    BinaryTreeIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__begin1);
  }
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~BinaryTree(&family);
  return 0;
}

Assistant:

int main()
{
	BinaryTree<std::string> family{
		new Node<std::string>{"me",
			new Node<std::string>{"mother",
				new Node<std::string>{"mother's mother"},
				new Node<std::string>{"mother's father"}
			},
			new Node<std::string>{"father",
				new Node<std::string>{"father's mother"},
				new Node<std::string>{"father's father"}
			}
		}
	};


	for(const auto& member : family)
	{
		std::cout << member << std::endl;
	}

	return 0;
}